

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall
DCanvas::DrawLine(DCanvas *this,int x0,int y0,int x1,int y1,int palColor,uint32 realcolor)

{
  uint uVar1;
  BYTE *pBVar2;
  int xx;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint level;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  if (palColor < 0) {
    palColor = PalFromRGB(realcolor);
  }
  (*(this->super_DObject)._vptr_DObject[8])(this,1);
  iVar8 = y0;
  iVar5 = x1;
  xx = x0;
  if (y1 < y0) {
    iVar8 = y1;
    iVar5 = x0;
    xx = x1;
    y1 = y0;
  }
  PUTTRANSDOT(this,xx,iVar8,palColor,0);
  uVar3 = iVar5 - xx;
  uVar6 = -uVar3;
  if (0 < (int)uVar3) {
    uVar6 = uVar3;
  }
  uVar1 = y1 - iVar8;
  if (uVar1 == 0) {
    if (x1 < x0) {
      x0 = x1;
    }
    memset(this->Buffer + (long)x0 + (long)iVar8 * (long)this->Pitch,palColor,(ulong)(uVar6 + 1));
  }
  else if (x0 == x1) {
    iVar5 = this->Pitch;
    pBVar2 = this->Buffer + (long)xx + (long)iVar8 * (long)iVar5;
    iVar8 = iVar8 - y1;
    do {
      *pBVar2 = (BYTE)palColor;
      pBVar2 = pBVar2 + iVar5;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
  }
  else {
    uVar4 = (int)uVar3 >> 0x1f | 1;
    if (uVar6 == uVar1) {
      iVar5 = this->Pitch;
      pBVar2 = this->Buffer + (long)xx + (long)(iVar8 * iVar5);
      do {
        *pBVar2 = (BYTE)palColor;
        pBVar2 = pBVar2 + (int)(uVar4 + iVar5);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    else {
      if ((int)uVar6 < (int)uVar1) {
        uVar6 = (uVar6 << 0x10) / uVar1 & 0xffff;
        if ((int)uVar3 < 0) {
          if (uVar1 != 1) {
            iVar8 = iVar8 + 1;
            uVar3 = 0;
            do {
              uVar3 = uVar3 + uVar6;
              uVar1 = uVar3 >> 10 & 0x3f;
              PUTTRANSDOT(this,xx - (uVar3 >> 0x10),iVar8,palColor,uVar1);
              PUTTRANSDOT(this,~(uVar3 >> 0x10) + xx,iVar8,palColor,uVar1 ^ 0x3f);
              iVar8 = iVar8 + 1;
            } while (y1 != iVar8);
          }
        }
        else if (uVar1 != 1) {
          iVar8 = iVar8 + 1;
          uVar3 = 0;
          do {
            uVar3 = uVar3 + uVar6;
            uVar1 = uVar3 >> 10 & 0x3f;
            iVar7 = (uVar3 >> 0x10) + xx;
            PUTTRANSDOT(this,iVar7,iVar8,palColor,uVar1);
            PUTTRANSDOT(this,iVar7 + uVar4,iVar8,palColor,uVar1 ^ 0x3f);
            iVar8 = iVar8 + 1;
          } while (y1 != iVar8);
        }
      }
      else {
        uVar3 = 0;
        iVar7 = uVar6 - 1;
        if (iVar7 != 0) {
          do {
            xx = xx + uVar4;
            uVar3 = uVar3 + ((uVar1 * 0x10000) / uVar6 & 0xffff);
            level = uVar3 >> 10 & 0x3f;
            PUTTRANSDOT(this,xx,(uVar3 >> 0x10) + iVar8,palColor,level);
            PUTTRANSDOT(this,xx,(uVar3 >> 0x10) + iVar8 + 1,palColor,level ^ 0x3f);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      PUTTRANSDOT(this,iVar5,y1,palColor,0);
    }
  }
  (*(this->super_DObject)._vptr_DObject[9])();
  return;
}

Assistant:

void DCanvas::DrawLine(int x0, int y0, int x1, int y1, int palColor, uint32 realcolor)
//void DrawTransWuLine (int x0, int y0, int x1, int y1, BYTE palColor)
{
	const int WeightingScale = 0;
	const int WEIGHTBITS = 6;
	const int WEIGHTSHIFT = 16-WEIGHTBITS;
	const int NUMWEIGHTS = (1<<WEIGHTBITS);
	const int WEIGHTMASK = (NUMWEIGHTS-1);

	if (palColor < 0)
	{
		palColor = PalFromRGB(realcolor);
	}

	Lock();
	int deltaX, deltaY, xDir;

	if (y0 > y1)
	{
		int temp = y0; y0 = y1; y1 = temp;
		temp = x0; x0 = x1; x1 = temp;
	}

	PUTTRANSDOT (x0, y0, palColor, 0);

	if ((deltaX = x1 - x0) >= 0)
	{
		xDir = 1;
	}
	else
	{
		xDir = -1;
		deltaX = -deltaX;
	}

	if ((deltaY = y1 - y0) == 0)
	{ // horizontal line
		if (x0 > x1)
		{
			swapvalues (x0, x1);
		}
		memset (GetBuffer() + y0*GetPitch() + x0, palColor, deltaX+1);
	}
	else if (deltaX == 0)
	{ // vertical line
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int pitch = GetPitch ();
		do
		{
			*spot = palColor;
			spot += pitch;
		} while (--deltaY != 0);
	}
	else if (deltaX == deltaY)
	{ // diagonal line.
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int advance = GetPitch() + xDir;
		do
		{
			*spot = palColor;
			spot += advance;
		} while (--deltaY != 0);
	}
	else
	{
		// line is not horizontal, diagonal, or vertical
		fixed_t errorAcc = 0;

		if (deltaY > deltaX)
		{ // y-major line
			fixed_t errorAdj = (((unsigned)deltaX << 16) / (unsigned)deltaY) & 0xffff;
			if (xDir < 0)
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
			else
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
		}
		else
		{ // x-major line
			fixed_t errorAdj = (((DWORD) deltaY << 16) / (DWORD) deltaX) & 0xffff;

			if (WeightingScale == 0)
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
			else
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
		}
		PUTTRANSDOT (x1, y1, palColor, 0);
	}
	Unlock();
}